

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

View<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::operator=
          (View<int,_false,_std::allocator<unsigned_long>_> *this,int *value)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  size_t sVar4;
  reference piVar5;
  size_t j;
  size_t sVar6;
  iterator it;
  iterator local_50;
  
  marray_detail::Assert<bool>(this->data_ != (pointer)0x0);
  bVar3 = isSimple(this);
  if (bVar3) {
    piVar2 = this->data_;
    sVar4 = (this->geometry_).size_;
    for (sVar6 = 0; sVar4 != sVar6; sVar6 = sVar6 + 1) {
      piVar2[sVar6] = *value;
    }
  }
  else {
    sVar4 = dimension(this);
    if (sVar4 == 1) {
      marray_detail::
      OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
      ::operate(this,value,this->data_);
    }
    else {
      sVar4 = dimension(this);
      if (sVar4 == 2) {
        marray_detail::
        OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
        ::operate(this,value,this->data_);
      }
      else {
        sVar4 = dimension(this);
        if (sVar4 == 3) {
          marray_detail::
          OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
          ::operate(this,value,this->data_);
        }
        else {
          sVar4 = dimension(this);
          if (sVar4 == 4) {
            marray_detail::
            OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
            ::operate(this,value,this->data_);
          }
          else {
            sVar4 = dimension(this);
            if (sVar4 == 5) {
              marray_detail::
              OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
              ::operate(this,value,this->data_);
            }
            else {
              sVar4 = dimension(this);
              if (sVar4 == 6) {
                marray_detail::
                OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                ::operate(this,value,this->data_);
              }
              else {
                sVar4 = dimension(this);
                if (sVar4 == 7) {
                  marray_detail::
                  OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                  ::operate(this,value,this->data_);
                }
                else {
                  sVar4 = dimension(this);
                  if (sVar4 == 8) {
                    marray_detail::
                    OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                    ::operate(this,value,this->data_);
                  }
                  else {
                    sVar4 = dimension(this);
                    if (sVar4 == 9) {
                      marray_detail::
                      OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                      ::operate(this,value,this->data_);
                    }
                    else {
                      sVar4 = dimension(this);
                      if (sVar4 == 10) {
                        marray_detail::
                        OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_std::allocator<unsigned_long>_>
                        ::operate(this,value,this->data_);
                      }
                      else {
                        begin(&local_50,this);
                        while( true ) {
                          bVar3 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore
                                            (&local_50);
                          if (!bVar3) break;
                          iVar1 = *value;
                          piVar5 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                                             (&local_50);
                          *piVar5 = iVar1;
                          Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                                    (&local_50);
                        }
                        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::
                        ~_Vector_base(&local_50.coordinates_.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     );
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

inline View<T, isConst, A>& 
View<T, isConst, A>::operator=
(
    const T& value
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || data_ != 0);
    if(isSimple()) {
        for(std::size_t j=0; j<geometry_.size(); ++j) {
            data_[j] = value;
        }
    }
    else if(dimension() == 1)
        marray_detail::OperateHelperBinaryScalar<1, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 2)
        marray_detail::OperateHelperBinaryScalar<2, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 3)
        marray_detail::OperateHelperBinaryScalar<3, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 4)
        marray_detail::OperateHelperBinaryScalar<4, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 5)
        marray_detail::OperateHelperBinaryScalar<5, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 6)
        marray_detail::OperateHelperBinaryScalar<6, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 7)
        marray_detail::OperateHelperBinaryScalar<7, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 8)
        marray_detail::OperateHelperBinaryScalar<8, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 9)
        marray_detail::OperateHelperBinaryScalar<9, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else if(dimension() == 10)
        marray_detail::OperateHelperBinaryScalar<10, marray_detail::Assign<T, T>, T, T, A>::operate(*this, value, marray_detail::Assign<T, T>(), data_);
    else {
        for(iterator it = begin(); it.hasMore(); ++it) {
            *it = value;
        }
    }
    return *this;
}